

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sysextest.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  allocator_type local_d9;
  vector<unsigned_char,_std::allocator<unsigned_char>_> fullsysex;
  vector<unsigned_char,_std::allocator<unsigned_char>_> midsysex;
  vector<unsigned_char,_std::allocator<unsigned_char>_> endsysex;
  vector<unsigned_char,_std::allocator<unsigned_char>_> startsysex;
  MidiFile outputfile;
  
  smf::MidiFile::MidiFile(&outputfile);
  smf::MidiFile::addTrack(&outputfile,2);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&fullsysex,0xe,(allocator_type *)&startsysex);
  *fullsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = 0xf0;
  fullsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 'C';
  fullsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\x12';
  fullsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\0';
  fullsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = 'C';
  fullsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[5] = '\x12';
  fullsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[6] = '\0';
  fullsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[7] = 'B';
  fullsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[8] = '\x12';
  fullsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[9] = '\0';
  fullsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[10] = 'C';
  fullsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xb] = '\x12';
  fullsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xc] = '\0';
  fullsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[0xd] = 0xf7;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&startsysex,4,(allocator_type *)&midsysex);
  *startsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = 0xf0;
  startsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 'C';
  startsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\x12';
  startsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&midsysex,7,(allocator_type *)&endsysex);
  *midsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = 0xf7;
  midsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 'C';
  midsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\x12';
  midsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\0';
  midsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = 'B';
  midsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[5] = '\x12';
  midsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[6] = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector(&endsysex,5,&local_d9);
  *endsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
   super__Vector_impl_data._M_start = 0xf7;
  endsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[1] = 'C';
  endsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[2] = '\x12';
  endsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[3] = '\0';
  endsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start[4] = 0xf7;
  smf::MidiFile::setTicksPerQuarterNote(&outputfile,100);
  smf::MidiFile::addEvent(&outputfile,1,0,&fullsysex);
  smf::MidiFile::addEvent(&outputfile,2,0,&startsysex);
  smf::MidiFile::addEvent(&outputfile,2,100,&midsysex);
  smf::MidiFile::addEvent(&outputfile,2,200,&endsysex);
  smf::MidiFile::writeBinasc(&outputfile,(ostream *)&std::cout);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&endsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&midsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&startsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&fullsysex.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  smf::MidiFile::~MidiFile(&outputfile);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
   MidiFile outputfile;        // create an empty MIDI file with one track
   outputfile.addTrack(2);     // Add another two tracks to the MIDI file

   vector<uchar> fullsysex(14);
   fullsysex[0]  = 0xf0;
   // message size will automatically be inserted here when
   // writing to a MIDI file.
   fullsysex[1]  = 0x43;
   fullsysex[2]  = 0x12;
   fullsysex[3]  = 0x00;
   fullsysex[4]  = 0x43;
   fullsysex[5]  = 0x12;
   fullsysex[6]  = 0x00;
   fullsysex[7]  = 0x42;
   fullsysex[8]  = 0x12;
   fullsysex[9]  = 0x00;
   fullsysex[10] = 0x43;
   fullsysex[11] = 0x12;
   fullsysex[12] = 0x00;
   fullsysex[13] = 0xf7;

   vector<uchar> startsysex(4);
   startsysex[0] = 0xf0;
   // Partial message size will automatically be inserted here when
   // writing to a MIDI file (size = 3 bytes).
   startsysex[1] = 0x43;
   startsysex[2] = 0x12;
   startsysex[3] = 0x00;

   vector<uchar> midsysex(7);
   midsysex[0]   = 0xf7;      // sysex continuation marker (not part of msg.)
   // Partial message size will automatically be inserted here when
   // writing to a MIDI file (size = 6 bytes).
   midsysex[1]   = 0x43;
   midsysex[2]   = 0x12;
   midsysex[3]   = 0x00;
   midsysex[4]   = 0x42;
   midsysex[5]   = 0x12;
   midsysex[6]   = 0x00;

   vector<uchar> endsysex(5);
   endsysex[0]   = 0xf7;      // sysex continuation marker (not part of msg.)
   // Partial message size will automatically be inserted here when
   // writing to a MIDI file (size = 4 bytes).
   endsysex[1]   = 0x43;
   endsysex[2]   = 0x12;
   endsysex[3]   = 0x00;
   endsysex[4]   = 0xf7;      // sysex termination marker (part of msg.)

   outputfile.setTicksPerQuarterNote(100);
   outputfile.addEvent(1,   0, fullsysex );
   outputfile.addEvent(2,   0, startsysex);
   outputfile.addEvent(2, 100, midsysex  );
   outputfile.addEvent(2, 200, endsysex  );

   outputfile.writeBinasc(cout);
   //outputfile.writeHex(cout);
   return 0;
}